

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O1

exr_result_t
internal_exr_compute_tile_information(exr_context_t ctxt,exr_priv_part_t curpart,int rebuild)

{
  ulong uVar1;
  int32_t *piVar2;
  int32_t *piVar3;
  byte bVar4;
  exr_attr_tiledesc_t *peVar5;
  exr_result_t eVar6;
  uint uVar7;
  long lVar8;
  int32_t *piVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  bool bVar24;
  int64_t dsize;
  int64_t dsize_1;
  
  if ((curpart->storage_mode < (EXR_STORAGE_LAST_TYPE|EXR_STORAGE_DEEP_SCANLINE)) &&
     ((0x25U >> (curpart->storage_mode & 0x1f) & 1) != 0)) {
    return 0;
  }
  if ((ctxt->mode == '\x04') && (curpart->tiles == (exr_attribute_t *)0x0)) {
    return 0;
  }
  if (rebuild != 0) {
    if (curpart->dataWindow == (exr_attribute_t *)0x0) {
      return 0;
    }
    if (curpart->tiles == (exr_attribute_t *)0x0) {
      return 0;
    }
  }
  if (curpart->tiles == (exr_attribute_t *)0x0) {
    eVar6 = (*ctxt->standard_error)(ctxt,0xd);
    return eVar6;
  }
  if ((rebuild != 0) && (curpart->tile_level_tile_count_x != (int32_t *)0x0)) {
    (*ctxt->free_fn)(curpart->tile_level_tile_count_x);
    curpart->tile_level_tile_count_x = (int32_t *)0x0;
  }
  if (curpart->tile_level_tile_count_x != (int32_t *)0x0) {
    return 0;
  }
  peVar5 = (curpart->tiles->field_6).tiledesc;
  if ((peVar5->x_size == 0) || (peVar5->y_size == 0)) {
LAB_00125f87:
    eVar6 = 0xe;
LAB_00125f8f:
    eVar6 = (*ctxt->standard_error)(ctxt,eVar6);
  }
  else {
    lVar17 = (long)(curpart->data_window).min.x;
    lVar8 = (long)(curpart->data_window).min.y;
    lVar19 = (long)(curpart->data_window).max.x;
    lVar12 = (long)(curpart->data_window).max.y;
    lVar20 = lVar19 - lVar17;
    uVar23 = lVar20 + 1;
    lVar13 = lVar12 - lVar8;
    uVar1 = lVar13 + 1;
    bVar4 = peVar5->level_and_round;
    uVar14 = 1;
    uVar18 = uVar23;
    if ((bVar4 & 0xf) == 0) {
      uVar22 = 1;
    }
    else if ((bVar4 & 0xf) == 2) {
      uVar14 = 1;
      uVar22 = 1;
      if (bVar4 < 0x10) {
        if (0 < lVar20) {
          uVar14 = 1;
          uVar16 = uVar23;
          do {
            uVar14 = uVar14 + 1;
            bVar24 = 3 < uVar16;
            uVar16 = uVar16 >> 1;
          } while (bVar24);
        }
        if (0 < lVar13) {
          uVar22 = 1;
          uVar16 = uVar1;
          do {
            uVar22 = uVar22 + 1;
            bVar24 = 3 < uVar16;
            uVar16 = uVar16 >> 1;
          } while (bVar24);
        }
      }
      else {
        if (0 < lVar20) {
          iVar15 = 0;
          iVar11 = 1;
          uVar16 = uVar23;
          do {
            if ((uVar16 & 1) != 0) {
              iVar15 = 1;
            }
            uVar18 = uVar16 >> 1;
            iVar11 = iVar11 + 1;
            bVar24 = 3 < uVar16;
            uVar16 = uVar18;
          } while (bVar24);
          uVar14 = iVar15 + iVar11;
        }
        if (0 < lVar13) {
          iVar15 = 0;
          iVar11 = 1;
          uVar16 = uVar1;
          do {
            if ((uVar16 & 1) != 0) {
              iVar15 = 1;
            }
            uVar18 = uVar16 >> 1;
            iVar11 = iVar11 + 1;
            bVar24 = 3 < uVar16;
            uVar16 = uVar18;
          } while (bVar24);
          uVar22 = iVar15 + iVar11;
        }
      }
    }
    else {
      if ((bVar4 & 0xf) != 1) goto LAB_00125f87;
      uVar16 = uVar1;
      if ((long)uVar1 < (long)uVar23) {
        uVar16 = uVar23;
      }
      uVar22 = 1;
      if (bVar4 < 0x10) {
        if (1 < (long)uVar16) {
          uVar14 = 1;
          do {
            uVar14 = uVar14 + 1;
            bVar24 = 3 < uVar16;
            uVar16 = uVar16 >> 1;
            uVar22 = uVar14;
          } while (bVar24);
        }
      }
      else if (1 < (long)uVar16) {
        iVar15 = 0;
        iVar11 = 1;
        do {
          if ((uVar16 & 1) != 0) {
            iVar15 = 1;
          }
          uVar18 = uVar16 >> 1;
          iVar11 = iVar11 + 1;
          bVar24 = 3 < uVar16;
          uVar16 = uVar18;
        } while (bVar24);
        uVar14 = iVar15 + iVar11;
        uVar22 = uVar14;
      }
    }
    curpart->num_tile_levels_x = uVar14;
    curpart->num_tile_levels_y = uVar22;
    piVar9 = (int32_t *)(*ctxt->alloc_fn)((long)(int)(uVar22 + uVar14) << 3);
    if (piVar9 == (int32_t *)0x0) {
      eVar6 = 1;
      goto LAB_00125f8f;
    }
    piVar2 = piVar9 + (int)uVar14;
    bVar24 = 0 < (int)uVar14;
    if (0 < (int)uVar14) {
      uVar16 = 0;
      do {
        lVar10 = (long)uVar23 / (1L << ((byte)uVar16 & 0x3f));
        lVar10 = (ulong)(lVar10 << ((byte)uVar16 & 0x3f) <= lVar20 &&
                        (peVar5->level_and_round & 0xf0) == 0x10) + lVar10;
        lVar21 = lVar10;
        if (lVar10 < 2) {
          lVar21 = 1;
        }
        if (0x7fffffff < lVar10) {
          uVar7 = (*ctxt->print_error)
                            (ctxt,0xe,
                             "Invalid data window x dims (%d, %d) resulting in invalid tile level size (%ld) for level %d"
                             ,lVar17,lVar19,lVar21,(int)uVar16);
          uVar18 = (ulong)uVar7;
          break;
        }
        piVar9[uVar16] = (int32_t)(((lVar21 + (ulong)peVar5->x_size) - 1) / (ulong)peVar5->x_size);
        piVar2[uVar16] = (int32_t)lVar21;
        uVar16 = uVar16 + 1;
        bVar24 = uVar16 < uVar14;
      } while (uVar16 != uVar14);
    }
    eVar6 = (exr_result_t)uVar18;
    if (!bVar24) {
      piVar3 = piVar2 + (int)uVar14;
      bVar24 = 0 < (int)uVar22;
      if (0 < (int)uVar22) {
        uVar23 = 0;
        do {
          lVar19 = (long)uVar1 / (1L << ((byte)uVar23 & 0x3f));
          lVar19 = (ulong)(lVar19 << ((byte)uVar23 & 0x3f) <= lVar13 &&
                          (peVar5->level_and_round & 0xf0) == 0x10) + lVar19;
          lVar17 = lVar19;
          if (lVar19 < 2) {
            lVar17 = 1;
          }
          if (lVar19 < 0x80000000) {
            piVar3[uVar23] =
                 (int32_t)(((lVar17 + (ulong)peVar5->y_size) - 1) / (ulong)peVar5->y_size);
            (piVar3 + (int)uVar22)[uVar23] = (int32_t)lVar17;
          }
          else {
            uVar14 = (*ctxt->print_error)
                               (ctxt,0xe,
                                "Invalid data window y dims (%d, %d) resulting in invalid tile level size (%ld) for level %d"
                                ,lVar8,lVar12,lVar17,(int)uVar23);
            uVar18 = (ulong)uVar14;
          }
          eVar6 = (exr_result_t)uVar18;
          if (0x7fffffff < lVar19) break;
          uVar23 = uVar23 + 1;
          bVar24 = uVar23 < uVar22;
        } while (uVar23 != uVar22);
      }
      if (!bVar24) {
        curpart->tile_level_tile_count_x = piVar9;
        curpart->tile_level_tile_count_y = piVar3;
        curpart->tile_level_tile_size_x = piVar2;
        curpart->tile_level_tile_size_y = piVar3 + (int)uVar22;
        bVar24 = true;
        goto LAB_00125f97;
      }
    }
  }
  bVar24 = false;
LAB_00125f97:
  if (bVar24) {
    return 0;
  }
  return eVar6;
}

Assistant:

exr_result_t
internal_exr_compute_tile_information (
    exr_context_t ctxt, exr_priv_part_t curpart, int rebuild)
{
    exr_result_t rv = EXR_ERR_SUCCESS;
    if (curpart->storage_mode == EXR_STORAGE_SCANLINE ||
        curpart->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        curpart->storage_mode == EXR_STORAGE_UNKNOWN)
        return EXR_ERR_SUCCESS;

    if (ctxt->mode == EXR_CONTEXT_TEMPORARY && !curpart->tiles)
        return EXR_ERR_SUCCESS;

    if (rebuild && (!curpart->dataWindow || !curpart->tiles))
        return EXR_ERR_SUCCESS;

    if (!curpart->tiles)
        return ctxt->standard_error (ctxt, EXR_ERR_MISSING_REQ_ATTR);

    if (rebuild)
    {
        if (curpart->tile_level_tile_count_x)
        {
            ctxt->free_fn (curpart->tile_level_tile_count_x);
            curpart->tile_level_tile_count_x = NULL;
        }
    }

    if (curpart->tile_level_tile_count_x == NULL)
    {
        const exr_attr_box2i_t     dw       = curpart->data_window;
        const exr_attr_tiledesc_t* tiledesc = curpart->tiles->tiledesc;
        int64_t                    w, h;
        int32_t                    numX, numY;
        int32_t*                   levcntX = NULL;
        int32_t*                   levcntY = NULL;
        int32_t*                   levszX  = NULL;
        int32_t*                   levszY  = NULL;

        w = ((int64_t) dw.max.x) - ((int64_t) dw.min.x) + 1;
        h = ((int64_t) dw.max.y) - ((int64_t) dw.min.y) + 1;

        if (tiledesc->x_size == 0 || tiledesc->y_size == 0)
            return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ATTR);
        switch (EXR_GET_TILE_LEVEL_MODE ((*tiledesc)))
        {
            case EXR_TILE_ONE_LEVEL: numX = numY = 1; break;
            case EXR_TILE_MIPMAP_LEVELS:
                if (EXR_GET_TILE_ROUND_MODE ((*tiledesc)) ==
                    EXR_TILE_ROUND_DOWN)
                {
                    numX = floor_log2 (w > h ? w : h) + 1;
                    numY = numX;
                }
                else
                {
                    numX = ceil_log2 (w > h ? w : h) + 1;
                    numY = numX;
                }
                break;
            case EXR_TILE_RIPMAP_LEVELS:
                if (EXR_GET_TILE_ROUND_MODE ((*tiledesc)) ==
                    EXR_TILE_ROUND_DOWN)
                {
                    numX = floor_log2 (w) + 1;
                    numY = floor_log2 (h) + 1;
                }
                else
                {
                    numX = ceil_log2 (w) + 1;
                    numY = ceil_log2 (h) + 1;
                }
                break;
            case EXR_TILE_LAST_TYPE:
            default: return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ATTR);
        }

        curpart->num_tile_levels_x = numX;
        curpart->num_tile_levels_y = numY;
        levcntX                    = (int32_t*) ctxt->alloc_fn (
            2 * (size_t) (numX + numY) * sizeof (int32_t));
        if (levcntX == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        levszX  = levcntX + numX;
        levcntY = levszX + numX;
        levszY  = levcntY + numY;

        for (int32_t l = 0; l < numX; ++l)
        {
            int64_t sx = calc_level_size (
                dw.min.x, dw.max.x, l, EXR_GET_TILE_ROUND_MODE ((*tiledesc)));
            if (sx < 0 || sx > (int64_t) INT32_MAX)
                return ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ATTR,
                    "Invalid data window x dims (%d, %d) resulting in invalid tile level size (%" PRId64
                    ") for level %d",
                    dw.min.x,
                    dw.max.x,
                    sx,
                    l);
            levcntX[l] = (int32_t) (((uint64_t) sx + tiledesc->x_size - 1) /
                                    tiledesc->x_size);
            levszX[l]  = (int32_t) sx;
        }

        for (int32_t l = 0; l < numY; ++l)
        {
            int64_t sy = calc_level_size (
                dw.min.y, dw.max.y, l, EXR_GET_TILE_ROUND_MODE ((*tiledesc)));
            if (sy < 0 || sy > (int64_t) INT32_MAX)
                return ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ATTR,
                    "Invalid data window y dims (%d, %d) resulting in invalid tile level size (%" PRId64
                    ") for level %d",
                    dw.min.y,
                    dw.max.y,
                    sy,
                    l);
            levcntY[l] = (int32_t) (((uint64_t) sy + tiledesc->y_size - 1) /
                                    tiledesc->y_size);
            levszY[l]  = (int32_t) sy;
        }

        curpart->tile_level_tile_count_x = levcntX;
        curpart->tile_level_tile_count_y = levcntY;
        curpart->tile_level_tile_size_x  = levszX;
        curpart->tile_level_tile_size_y  = levszY;
    }
    return rv;
}